

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryScatterLoop<duckdb::BitState<unsigned_short>,unsigned_short,duckdb::BitXorOperation>
               (unsigned_short *idata,AggregateInputData *aggr_input_data,
               BitState<unsigned_short> **states,SelectionVector *isel,SelectionVector *ssel,
               ValidityMask *mask,idx_t count)

{
  bool bVar1;
  BitState<unsigned_short> *state;
  SelectionVector *in_RCX;
  AggregateInputData *in_RSI;
  SelectionVector *in_R8;
  TemplatedValidityMask<unsigned_long> *in_R9;
  idx_t sidx_1;
  idx_t i_1;
  AggregateUnaryInput input_1;
  idx_t sidx;
  idx_t i;
  AggregateUnaryInput input;
  unsigned_short *in_stack_ffffffffffffff78;
  BitState<unsigned_short> *in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  ulong idx;
  AggregateUnaryInput local_70;
  idx_t local_58;
  ulong local_50;
  AggregateUnaryInput local_48;
  TemplatedValidityMask<unsigned_long> *local_30;
  SelectionVector *local_28;
  SelectionVector *local_20;
  AggregateInputData *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar1 = BitwiseOperation::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_30), bVar1)) {
    AggregateUnaryInput::AggregateUnaryInput(&local_70,local_10,(ValidityMask *)local_30);
    for (idx = 0; idx < sidx_1; idx = idx + 1) {
      local_70.input_idx = SelectionVector::get_index(local_20,idx);
      state = (BitState<unsigned_short> *)SelectionVector::get_index(local_28,idx);
      BitwiseOperation::
      Operation<unsigned_short,duckdb::BitState<unsigned_short>,duckdb::BitXorOperation>
                (state,in_stack_ffffffffffffff78,(AggregateUnaryInput *)0x98f7ed);
    }
  }
  else {
    AggregateUnaryInput::AggregateUnaryInput(&local_48,local_10,(ValidityMask *)local_30);
    for (local_50 = 0; local_50 < sidx_1; local_50 = local_50 + 1) {
      local_48.input_idx = SelectionVector::get_index(local_20,local_50);
      local_58 = SelectionVector::get_index(local_28,local_50);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80);
      if (bVar1) {
        BitwiseOperation::
        Operation<unsigned_short,duckdb::BitState<unsigned_short>,duckdb::BitXorOperation>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (AggregateUnaryInput *)0x98f754);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryScatterLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                    STATE_TYPE **__restrict states, const SelectionVector &isel,
	                                    const SelectionVector &ssel, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			AggregateUnaryInput input(aggr_input_data, mask);
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = isel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[sidx], idata[input.input_idx], input);
			}
		}
	}